

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O3

void CP_validateParams(SstStream Stream,SstParams Params,int Writer)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  __int32_t *p_Var4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  __int32_t **pp_Var8;
  long lVar9;
  char *pcVar10;
  char cVar11;
  int tmp;
  uint local_3c;
  int *local_38;
  
  uVar2 = Params->RendezvousReaderCount;
  if ((int)uVar2 < 0) {
    fprintf(_stderr,"Invalid RendezvousReaderCount parameter value (%d) for SST Stream %s\n",
            (ulong)uVar2,Stream->Filename);
  }
  else {
    Stream->RendezvousReaderCount = uVar2;
  }
  uVar2 = Params->QueueLimit;
  if ((int)uVar2 < 0) {
    fprintf(_stderr,"Invalid QueueLimit parameter value (%d) for SST Stream %s\n",(ulong)uVar2,
            Stream->Filename);
  }
  else {
    Stream->QueueLimit = uVar2;
  }
  Stream->QueueFullPolicy = (SstQueueFullPolicy)Params->QueueFullPolicy;
  Stream->RegistrationMethod = (SstRegistrationMethod)Params->RegistrationMethod;
  pcVar10 = Params->DataTransport;
  if (pcVar10 != (char *)0x0) {
    sVar6 = strlen(pcVar10);
    pcVar7 = (char *)malloc(sVar6 + 1);
    cVar11 = *pcVar10;
    if (cVar11 == '\0') {
      lVar9 = 0;
    }
    else {
      pp_Var8 = __ctype_tolower_loc();
      p_Var4 = *pp_Var8;
      lVar9 = 0;
      do {
        pcVar7[lVar9] = (char)p_Var4[cVar11];
        cVar11 = pcVar10[lVar9 + 1];
        lVar9 = lVar9 + 1;
      } while (cVar11 != '\0');
    }
    pcVar7[lVar9] = '\0';
    free(pcVar10);
    iVar5 = strcmp(pcVar7,"wan");
    if ((iVar5 == 0) || (iVar5 = strcmp(pcVar7,"evpath"), iVar5 == 0)) {
      pcVar10 = "evpath";
    }
    else {
      iVar5 = strcmp(pcVar7,"rdma");
      if ((iVar5 == 0) ||
         ((((*pcVar7 == 'i' && (pcVar7[1] == 'b')) && (pcVar7[2] == '\0')) ||
          (iVar5 = strcmp(pcVar7,"fabric"), iVar5 == 0)))) {
        pcVar10 = "rdma";
      }
      else {
        iVar5 = strcmp(pcVar7,"ucx");
        pcVar10 = pcVar7;
        if (iVar5 == 0) {
          pcVar10 = "ucx";
        }
      }
    }
    pcVar10 = strdup(pcVar10);
    Params->DataTransport = pcVar10;
    free(pcVar7);
  }
  pcVar10 = Params->ControlTransport;
  if (pcVar10 == (char *)0x0) {
    pcVar10 = strdup("sockets");
    Params->ControlTransport = pcVar10;
  }
  else {
    sVar6 = strlen(pcVar10);
    pcVar7 = (char *)malloc(sVar6 + 1);
    cVar11 = *pcVar10;
    if (cVar11 == '\0') {
      lVar9 = 0;
    }
    else {
      pp_Var8 = __ctype_tolower_loc();
      p_Var4 = *pp_Var8;
      lVar9 = 0;
      do {
        pcVar7[lVar9] = (char)p_Var4[cVar11];
        cVar11 = pcVar10[lVar9 + 1];
        lVar9 = lVar9 + 1;
      } while (cVar11 != '\0');
    }
    pcVar7[lVar9] = '\0';
    iVar5 = strcmp(pcVar7,"sockets");
    if ((iVar5 == 0) || (iVar5 = strcmp(pcVar7,"tcp"), iVar5 == 0)) {
      pcVar10 = "sockets";
LAB_00731eda:
      pcVar10 = strdup(pcVar10);
      Params->ControlTransport = pcVar10;
    }
    else {
      iVar5 = strcmp(pcVar7,"udp");
      if (((iVar5 == 0) || (iVar5 = strcmp(pcVar7,"rudp"), iVar5 == 0)) ||
         ((iVar5 = strcmp(pcVar7,"scalable"), iVar5 == 0 ||
          (iVar5 = strcmp(pcVar7,"enet"), iVar5 == 0)))) {
        pcVar10 = "enet";
        goto LAB_00731eda;
      }
    }
    free(pcVar7);
  }
  piVar1 = &Stream->ConnectionUsleepMultiplier;
  Stream->ConnectionUsleepMultiplier = 0x32;
  iVar5 = strcmp(pcVar10,"enet");
  if ((iVar5 == 0) && (pcVar7 = getenv("USLEEP_MULTIPLIER"), pcVar7 != (char *)0x0)) {
    __isoc99_sscanf("%d",pcVar7,piVar1);
    pcVar10 = Params->ControlTransport;
  }
  cVar11 = *pcVar10;
  local_38 = piVar1;
  if (cVar11 != '\0') {
    lVar9 = 1;
    pp_Var8 = __ctype_tolower_loc();
    pcVar7 = pcVar10;
    do {
      *pcVar7 = (char)(*pp_Var8)[cVar11];
      pcVar10 = Params->ControlTransport;
      pcVar7 = pcVar10 + lVar9;
      cVar11 = pcVar10[lVar9];
      lVar9 = lVar9 + 1;
    } while (cVar11 != '\0');
  }
  iVar5 = strcmp(pcVar10,"enet");
  if ((iVar5 == 0) && (pcVar7 = getenv("USLEEP_MULTIPLIER"), pcVar7 != (char *)0x0)) {
    iVar5 = __isoc99_sscanf(pcVar7,"%d",&local_3c);
    if (iVar5 == 1) {
      *local_38 = local_3c;
    }
    else {
      local_3c = *local_38;
    }
    CP_verbose(Stream,PerStepVerbose,"USING %d as usleep multiplier before connections\n",
               (ulong)local_3c);
    pcVar10 = Params->ControlTransport;
  }
  CP_verbose(Stream,PerStepVerbose,"Sst set to use %s as a Control Transport\n",pcVar10);
  pcVar10 = Params->ControlModule;
  if (pcVar10 == (char *)0x0) {
    pcVar10 = strdup("select");
    Params->ControlModule = pcVar10;
    goto LAB_007320b9;
  }
  sVar6 = strlen(pcVar10);
  pcVar7 = (char *)malloc(sVar6 + 1);
  cVar11 = *pcVar10;
  if (cVar11 == '\0') {
    lVar9 = 0;
  }
  else {
    pp_Var8 = __ctype_tolower_loc();
    p_Var4 = *pp_Var8;
    lVar9 = 0;
    do {
      pcVar7[lVar9] = (char)p_Var4[cVar11];
      cVar11 = pcVar10[lVar9 + 1];
      lVar9 = lVar9 + 1;
    } while (cVar11 != '\0');
  }
  pcVar7[lVar9] = '\0';
  iVar5 = strcmp(pcVar7,"select");
  if (iVar5 == 0) {
    pcVar10 = "select";
LAB_007320a5:
    pcVar10 = strdup(pcVar10);
    Params->ControlModule = pcVar10;
  }
  else {
    iVar5 = strcmp(pcVar7,"epoll");
    if (iVar5 == 0) {
      pcVar10 = "epoll";
      goto LAB_007320a5;
    }
    fprintf(_stderr,"Invalid ControlModule parameter (%s) for SST Stream %s\n",pcVar10,
            Stream->Filename);
  }
  free(pcVar7);
LAB_007320b9:
  iVar5 = Params->verbose;
  iVar3 = Stream->CPVerbosityLevel;
  if (iVar3 < iVar5) {
    Stream->CPVerbosityLevel = iVar5;
  }
  else if (iVar5 < iVar3) {
    Params->verbose = iVar3;
  }
  return;
}

Assistant:

void CP_validateParams(SstStream Stream, SstParams Params, int Writer)
{
    if (Params->RendezvousReaderCount >= 0)
    {
        Stream->RendezvousReaderCount = Params->RendezvousReaderCount;
    }
    else
    {
        fprintf(stderr,
                "Invalid RendezvousReaderCount parameter value (%d) "
                "for SST Stream %s\n",
                Params->RendezvousReaderCount, Stream->Filename);
    }
    if (Params->QueueLimit >= 0)
    {
        Stream->QueueLimit = Params->QueueLimit;
    }
    else
    {
        fprintf(stderr, "Invalid QueueLimit parameter value (%d) for SST Stream %s\n",
                Params->QueueLimit, Stream->Filename);
    }
    Stream->QueueFullPolicy = (SstQueueFullPolicy)Params->QueueFullPolicy;
    Stream->RegistrationMethod = (SstRegistrationMethod)Params->RegistrationMethod;
    if (Params->DataTransport != NULL)
    {
        int i;
        char *SelectedTransport = malloc(strlen(Params->DataTransport) + 1);
        for (i = 0; Params->DataTransport[i] != 0; i++)
        {
            SelectedTransport[i] = tolower(Params->DataTransport[i]);
        }
        SelectedTransport[i] = 0;
        /* free old */
        free(Params->DataTransport);

        /* canonicalize SelectedTransport */
        if ((strcmp(SelectedTransport, "wan") == 0) || (strcmp(SelectedTransport, "evpath") == 0))
        {
            Params->DataTransport = strdup("evpath");
        }
        else if ((strcmp(SelectedTransport, "rdma") == 0) ||
                 (strcmp(SelectedTransport, "ib") == 0) ||
                 (strcmp(SelectedTransport, "fabric") == 0))
        {
            Params->DataTransport = strdup("rdma");
        }
        else if (strcmp(SelectedTransport, "ucx") == 0)
        {
            Params->DataTransport = strdup("ucx");
        }
        else
        {
            Params->DataTransport = strdup(SelectedTransport);
        }
        free(SelectedTransport);
    }
    if (Params->ControlTransport == NULL)
    {
        /* determine reasonable default, now "sockets" */
        Params->ControlTransport = strdup("sockets");
    }
    else
    {
        int i;
        char *SelectedTransport = malloc(strlen(Params->ControlTransport) + 1);
        for (i = 0; Params->ControlTransport[i] != 0; i++)
        {
            SelectedTransport[i] = tolower(Params->ControlTransport[i]);
        }
        SelectedTransport[i] = 0;

        /* canonicalize SelectedTransport */
        if ((strcmp(SelectedTransport, "sockets") == 0) || (strcmp(SelectedTransport, "tcp") == 0))
        {
            Params->ControlTransport = strdup("sockets");
        }
        else if ((strcmp(SelectedTransport, "udp") == 0) ||
                 (strcmp(SelectedTransport, "rudp") == 0) ||
                 (strcmp(SelectedTransport, "scalable") == 0) ||
                 (strcmp(SelectedTransport, "enet") == 0))
        {
            Params->ControlTransport = strdup("enet");
        }
        free(SelectedTransport);
    }
    Stream->ConnectionUsleepMultiplier = 50;
    if ((strcmp(Params->ControlTransport, "enet") == 0) && getenv("USLEEP_MULTIPLIER"))
    {
        sscanf("%d", getenv("USLEEP_MULTIPLIER"), &Stream->ConnectionUsleepMultiplier);
    }
    for (int i = 0; Params->ControlTransport[i] != 0; i++)
    {
        Params->ControlTransport[i] = tolower(Params->ControlTransport[i]);
    }
    if ((strcmp(Params->ControlTransport, "enet") == 0) && getenv("USLEEP_MULTIPLIER"))
    {
        int tmp;
        if (sscanf(getenv("USLEEP_MULTIPLIER"), "%d", &tmp) == 1)
        {
            Stream->ConnectionUsleepMultiplier = tmp;
        }
        CP_verbose(Stream, PerStepVerbose, "USING %d as usleep multiplier before connections\n",
                   Stream->ConnectionUsleepMultiplier);
    }
    CP_verbose(Stream, PerStepVerbose, "Sst set to use %s as a Control Transport\n",
               Params->ControlTransport);
    if (Params->ControlModule != NULL)
    {
        int i;
        char *SelectedModule = malloc(strlen(Params->ControlModule) + 1);
        for (i = 0; Params->ControlModule[i] != 0; i++)
        {
            SelectedModule[i] = tolower(Params->ControlModule[i]);
        }
        SelectedModule[i] = 0;

        /* canonicalize SelectedModule */
        if (strcmp(SelectedModule, "select") == 0)
        {
            Params->ControlModule = strdup("select");
        }
        else if (strcmp(SelectedModule, "epoll") == 0)
        {
            Params->ControlModule = strdup("epoll");
        }
        else
        {
            fprintf(stderr, "Invalid ControlModule parameter (%s) for SST Stream %s\n",
                    Params->ControlModule, Stream->Filename);
        }
        free(SelectedModule);
    }
    else
    {
        Params->ControlModule = strdup("select");
    }
    if (Params->verbose > Stream->CPVerbosityLevel)
    {
        Stream->CPVerbosityLevel = Params->verbose;
    }
    else if (Params->verbose < Stream->CPVerbosityLevel)
    {
        Params->verbose = Stream->CPVerbosityLevel;
    }
}